

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

double EDCircles::ComputeEllipseError(EllipseEquation *eq,double *px,double *py,int noPoints)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double yc;
  double xc;
  double minor;
  double major;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  dVar1 = eq->coeff[1];
  dVar2 = eq->coeff[2];
  dVar3 = eq->coeff[3];
  dVar4 = eq->coeff[4];
  dVar5 = eq->coeff[5];
  dVar6 = eq->coeff[6];
  ComputeEllipseCenterAndAxisLengths(eq,&local_40,&local_48,&local_30,&local_38);
  dVar9 = 0.0;
  if (0 < noPoints) {
    dVar11 = dVar3 + dVar3;
    uVar8 = 0;
    dVar9 = 0.0;
    do {
      dVar15 = px[uVar8] - local_40;
      dVar14 = py[uVar8] - local_48;
      if (ABS(dVar15) <= ABS(dVar14)) {
        dVar15 = dVar15 / dVar14;
        dVar17 = local_40 - dVar15 * local_48;
        dVar16 = dVar1 * dVar15 * dVar15 + dVar2 * dVar15 + dVar3;
        dVar12 = dVar4 * dVar15 + (dVar1 + dVar1) * dVar15 * dVar17 + dVar2 * dVar17 + dVar5;
        dVar14 = dVar12 * dVar12 +
                 dVar16 * -4.0 * (dVar1 * dVar17 * dVar17 + dVar4 * dVar17 + dVar6);
        dVar13 = 0.0;
        if (0.0 <= dVar14) {
          dVar13 = dVar14;
        }
        dVar10 = SQRT(dVar13);
        dVar14 = dVar10;
        if (dVar13 < 0.0) {
          dVar14 = sqrt(dVar13);
          dVar10 = sqrt(dVar13);
        }
        dVar13 = -(dVar14 + dVar12) / (dVar16 + dVar16);
        dVar12 = -(dVar12 - dVar10) / (dVar16 + dVar16);
        dVar14 = dVar15 * dVar13 + dVar17;
        dVar17 = dVar15 * dVar12 + dVar17;
        dVar15 = px[uVar8] - dVar14;
        dVar13 = py[uVar8] - dVar13;
        dVar15 = dVar15 * dVar15 + dVar13 * dVar13;
        dVar13 = px[uVar8] - dVar17;
        dVar12 = py[uVar8] - dVar12;
        dVar13 = dVar13 * dVar13 + dVar12 * dVar12;
        dVar17 = (double)(~-(ulong)(dVar15 < dVar13) & (ulong)dVar17 |
                         (ulong)dVar14 & -(ulong)(dVar15 < dVar13));
        dVar14 = dVar17;
        if (dVar13 <= dVar15) {
          dVar15 = dVar13;
        }
      }
      else {
        dVar14 = dVar14 / dVar15;
        dVar16 = local_48 - dVar14 * local_40;
        dVar13 = dVar3 * dVar14 * dVar14 + dVar2 * dVar14 + dVar1;
        dVar12 = dVar5 * dVar14 + dVar2 * dVar16 + dVar11 * dVar14 * dVar16 + dVar4;
        dVar15 = dVar12 * dVar12 +
                 dVar13 * -4.0 * (dVar3 * dVar16 * dVar16 + dVar5 * dVar16 + dVar6);
        dVar17 = 0.0;
        if (0.0 <= dVar15) {
          dVar17 = dVar15;
        }
        dVar10 = SQRT(dVar17);
        dVar15 = dVar10;
        if (dVar17 < 0.0) {
          dVar15 = sqrt(dVar17);
          dVar10 = sqrt(dVar17);
        }
        dVar17 = -(dVar15 + dVar12) / (dVar13 + dVar13);
        dVar12 = -(dVar12 - dVar10) / (dVar13 + dVar13);
        dVar13 = px[uVar8] - dVar17;
        dVar15 = py[uVar8] - (dVar14 * dVar17 + dVar16);
        dVar15 = dVar13 * dVar13 + dVar15 * dVar15;
        dVar13 = px[uVar8] - dVar12;
        dVar14 = py[uVar8] - (dVar14 * dVar12 + dVar16);
        dVar13 = dVar13 * dVar13 + dVar14 * dVar14;
        dVar17 = (double)(~-(ulong)(dVar15 < dVar13) & (ulong)dVar12 |
                         (ulong)dVar17 & -(ulong)(dVar15 < dVar13));
        dVar14 = dVar17;
        if (dVar13 <= dVar15) {
          dVar15 = dVar13;
        }
      }
      do {
        dVar17 = dVar17 + 0.5;
        dVar13 = dVar2 * dVar17 + dVar5;
        dVar16 = dVar13 * dVar13 + (dVar1 * dVar17 * dVar17 + dVar4 * dVar17 + dVar6) * dVar3 * -4.0
        ;
        dVar12 = 0.0;
        if (0.0 <= dVar16) {
          dVar12 = dVar16;
        }
        dVar10 = SQRT(dVar12);
        dVar16 = dVar10;
        if (dVar12 < 0.0) {
          dVar16 = sqrt(dVar12);
          dVar10 = sqrt(dVar12);
        }
        dVar16 = (dVar16 + dVar13) / dVar11 + py[uVar8];
        dVar12 = (px[uVar8] - dVar17) * (px[uVar8] - dVar17);
        dVar16 = dVar16 * dVar16 + dVar12;
        bVar7 = true;
        if ((dVar15 < dVar16) &&
           (dVar13 = py[uVar8] + (dVar13 - dVar10) / dVar11, dVar16 = dVar12 + dVar13 * dVar13,
           dVar15 < dVar16)) {
          bVar7 = false;
          dVar16 = dVar15;
        }
        dVar15 = dVar16;
      } while (bVar7);
      do {
        dVar14 = dVar14 + -0.5;
        dVar17 = dVar2 * dVar14 + dVar5;
        dVar13 = dVar17 * dVar17 + (dVar1 * dVar14 * dVar14 + dVar4 * dVar14 + dVar6) * dVar3 * -4.0
        ;
        dVar15 = 0.0;
        if (0.0 <= dVar13) {
          dVar15 = dVar13;
        }
        dVar12 = SQRT(dVar15);
        dVar13 = dVar12;
        if (dVar15 < 0.0) {
          dVar13 = sqrt(dVar15);
          dVar12 = sqrt(dVar15);
        }
        dVar13 = (dVar13 + dVar17) / dVar11 + py[uVar8];
        dVar15 = (px[uVar8] - dVar14) * (px[uVar8] - dVar14);
        dVar13 = dVar13 * dVar13 + dVar15;
        bVar7 = true;
        if ((dVar16 < dVar13) &&
           (dVar13 = py[uVar8] + (dVar17 - dVar12) / dVar11, dVar13 = dVar15 + dVar13 * dVar13,
           dVar16 < dVar13)) {
          bVar7 = false;
          dVar13 = dVar16;
        }
        dVar16 = dVar13;
      } while (bVar7);
      dVar9 = dVar9 + dVar13;
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)noPoints);
  }
  dVar9 = dVar9 / (double)noPoints;
  if (0.0 <= dVar9) {
    return SQRT(dVar9);
  }
  dVar1 = sqrt(dVar9);
  return dVar1;
}

Assistant:

double EDCircles::ComputeEllipseError(EllipseEquation * eq, double * px, double * py, int noPoints)
{
	double error = 0;

	double A = eq->A();
	double B = eq->B();
	double C = eq->C();
	double D = eq->D();
	double E = eq->E();
	double F = eq->F();

	double xc, yc, major, minor;
	ComputeEllipseCenterAndAxisLengths(eq, &xc, &yc, &major, &minor);

	for (int i = 0; i<noPoints; i++) {
		double dx = px[i] - xc;
		double dy = py[i] - yc;

		double min;
		double xs, ys;

		if (fabs(dx) > fabs(dy)) {
			// The line equation is of the form: y = mx+n
			double m = dy / dx;
			double n = yc - m*xc;

			// a*x^2 + b*x + c
			double a = A + B*m + C*m*m;
			double b = B*n + 2 * C*m*n + D + E*m;
			double c = C*n*n + E*n + F;
			double det = b*b - 4 * a*c;
			if (det<0) det = 0;
			double x1 = -(b + sqrt(det)) / (2 * a);
			double x2 = -(b - sqrt(det)) / (2 * a);

			double y1 = m*x1 + n;
			double y2 = m*x2 + n;

			dx = px[i] - x1;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dx = px[i] - x2;
			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1<d2) { min = d1; xs = x1; ys = y1; }
			else { min = d2; xs = x2; ys = y2; }

		}
		else {
			// The line equation is of the form: x = my+n
			double m = dx / dy;
			double n = xc - m*yc;

			// a*y^2 + b*y + c
			double a = A*m*m + B*m + C;
			double b = 2 * A*m*n + B*n + D*m + E;
			double c = A*n*n + D*n + F;
			double det = b*b - 4 * a*c;
			if (det<0) det = 0;
			double y1 = -(b + sqrt(det)) / (2 * a);
			double y2 = -(b - sqrt(det)) / (2 * a);

			double x1 = m*y1 + n;
			double x2 = m*y2 + n;

			dx = px[i] - x1;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dx = px[i] - x2;
			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1<d2) { min = d1; xs = x1; ys = y1; }
			else { min = d2; xs = x2; ys = y2; }
		} //end-else

		  // Refine the search in the vicinity of (xs, ys)
		double delta = 0.5;
		double x = xs;
		while (1) {
			x += delta;

			double a = C;
			double b = B*x + E;
			double c = A*x*x + D*x + F;
			double det = b*b - 4 * a*c;
			if (det < 0) det = 0;

			double y1 = -(b + sqrt(det)) / (2 * a);
			double y2 = -(b - sqrt(det)) / (2 * a);

			dx = px[i] - x;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1 <= min) { min = d1; }
			else if (d2 <= min) { min = d2; }
			else break;
		} //end-while

		x = xs;
		while (1) {
			x -= delta;

			double a = C;
			double b = B*x + E;
			double c = A*x*x + D*x + F;
			double det = b*b - 4 * a*c;
			if (det < 0) det = 0;

			double y1 = -(b + sqrt(det)) / (2 * a);
			double y2 = -(b - sqrt(det)) / (2 * a);

			dx = px[i] - x;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1 <= min) { min = d1; }
			else if (d2 <= min) { min = d2; }
			else break;
		} //end-while

		error += min;
	} //end-for

	error = sqrt(error / noPoints);

	return error;
}